

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# File.cpp
# Opt level: O2

int64 __thiscall File::size(File *this)

{
  __off_t _Var1;
  __off_t _Var2;
  __off_t _Var3;
  
  _Var1 = lseek(*(int *)&this->fp,0,1);
  _Var3 = -1;
  if ((((-1 < _Var1) && (_Var2 = lseek(*(int *)&this->fp,0,2), -1 < _Var2)) &&
      (_Var3 = _Var2, _Var1 != _Var2)) && (_Var1 = lseek(*(int *)&this->fp,_Var1,0), _Var1 < 0)) {
    return -1;
  }
  return _Var3;
}

Assistant:

int64 File::size()
{
#ifdef _WIN32
  LARGE_INTEGER fs;
  if(!GetFileSizeEx((HANDLE)fp, &fs))
    return -1;
  return fs.QuadPart;
#else
  // todo: use lstat?
  off64_t currentPosition = lseek((int)(intptr_t)fp, 0, SEEK_CUR);
  if(currentPosition < 0)
    return -1; 
  off64_t size = lseek((int)(intptr_t)fp, 0, SEEK_END);
  if(size < 0)
    return -1;
  if(currentPosition != size)
  {
    currentPosition = lseek((int)(intptr_t)fp, currentPosition, SEEK_SET);
    if(currentPosition < 0)
      return -1;
  }
  return size;
#endif
}